

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int SendDataMDMx(MDM *pMDM,uchar *buf,int buflen,int *pSentBytes)

{
  int iVar1;
  ssize_t sVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (pMDM->InternalBufferSize < buflen) {
    pcVar4 = "Too many data to send at once. ";
  }
  else {
    iVar1 = (pMDM->RS232Port).DevType;
    pcVar4 = "Error sending data with a MDM. ";
    if (iVar1 - 1U < 4) {
      sVar2 = send((pMDM->RS232Port).s,buf,(long)buflen,0);
      iVar1 = (int)sVar2;
      *pSentBytes = iVar1;
    }
    else {
      if (iVar1 != 0) goto LAB_0010a960;
      sVar2 = write(*(int *)&(pMDM->RS232Port).hDev,buf,(ulong)(uint)buflen);
      iVar1 = (int)sVar2;
      *pSentBytes = iVar1;
    }
    if (0 < iVar1) {
      return 0;
    }
  }
LAB_0010a960:
  pcVar3 = strtime_m();
  printf("SendDataMDM error (%s) : %s(pMDM=%#x)\n",pcVar3,pcVar4,(ulong)pMDM & 0xffffffff);
  return 1;
}

Assistant:

HARDWAREX_API int SendDataMDMx(MDM* pMDM, unsigned char* buf, int buflen, int* pSentBytes)
{
	return SendDataMDM(pMDM, buf, buflen, pSentBytes);
}